

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::setup(ShadersOOB *this)

{
  Functions *gl;
  glUseProgramFunc p_Var1;
  glGetUniformLocationFunc p_Var2;
  glGetAttribLocationFunc p_Var3;
  glGenBuffersFunc p_Var4;
  glBindBufferFunc p_Var5;
  glBufferDataFunc p_Var6;
  glBindBufferBaseFunc p_Var7;
  bool bVar8;
  deUint32 dVar9;
  GLenum GVar10;
  deBool dVar11;
  GLint GVar12;
  GLenum GVar13;
  TestError *pTVar14;
  size_type sVar15;
  reference pvVar16;
  const_reference pvVar17;
  GLuint local_21c;
  int bufNdx;
  GLenum resType;
  undefined1 local_200 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> refValues;
  GLfloat coords [8];
  GLint index;
  GLint indexLocation;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  ShadersOOB *this_local;
  
  gl = (this->super_ContextReset).m_gl;
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  genSources(&local_1b0,this);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,gl,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  glu::operator<<((this->super_ContextReset).m_log,(ShaderProgram *)local_e0);
  bVar8 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (!bVar8) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x50c);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  do {
    p_Var1 = ((this->super_ContextReset).m_gl)->useProgram;
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    (*p_Var1)(dVar9);
    GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar10,"useProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x50e);
    dVar11 = ::deGetFalse();
  } while (dVar11 != 0);
  p_Var2 = ((this->super_ContextReset).m_gl)->getUniformLocation;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  GVar12 = (*p_Var2)(dVar9,"u_index");
  GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar10,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x511);
  do {
    dVar11 = ::deGetFalse();
    if ((dVar11 != 0) || (GVar12 == -1)) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,"indexLocation != (glw::GLint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                 ,0x512);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar11 = ::deGetFalse();
  } while (dVar11 != 0);
  do {
    (*((this->super_ContextReset).m_gl)->uniform1i)(GVar12,-1);
    GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar10,"uniform1i(indexLocation, index)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x515);
    dVar11 = ::deGetFalse();
  } while (dVar11 != 0);
  if ((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) {
    refValues.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xbf800000bf800000;
    p_Var3 = ((this->super_ContextReset).m_gl)->getAttribLocation;
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar12 = (*p_Var3)(dVar9,"a_position");
    this->m_coordLocation = GVar12;
    GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar10,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x523);
    do {
      dVar11 = ::deGetFalse();
      if ((dVar11 != 0) || (this->m_coordLocation == -1)) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar14,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                   ,0x524);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    this->m_coordinatesBuffer = 0;
    do {
      (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
      GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar10,"genBuffers(1, &m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x528);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
      GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar10,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x529);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bufferData)
                (0x8892,0x20,
                 &refValues.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0x88e4);
      GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar10,
                      "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x52a);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
      GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar10,"enableVertexAttribArray(m_coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x52b);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
                (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
      GVar10 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar10,
                      "vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x52c);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&resType,0.0,1.0,1.0,1.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&bufNdx + 3));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_200,3,
             (value_type *)&resType,(allocator<tcu::Vector<float,_4>_> *)((long)&bufNdx + 3));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&bufNdx + 3));
  GVar10 = 0x90d2;
  if ((this->m_isUBO & 1U) != 0) {
    GVar10 = 0x8a11;
  }
  if ((this->m_isLocalArray & 1U) == 0) {
    do {
      p_Var4 = ((this->super_ContextReset).m_gl)->genBuffers;
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_buffers,0);
      (*p_Var4)((GLsizei)sVar15,pvVar16);
      GVar13 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar13,"genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x536);
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
    for (local_21c = 0;
        sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers),
        (int)local_21c < (int)sVar15; local_21c = local_21c + 1) {
      do {
        p_Var5 = ((this->super_ContextReset).m_gl)->bindBuffer;
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->m_buffers,(long)(int)local_21c);
        (*p_Var5)(GVar10,*pvVar16);
        GVar13 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar13,"bindBuffer(resType, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53a);
        dVar11 = ::deGetFalse();
      } while (dVar11 != 0);
      do {
        p_Var6 = ((this->super_ContextReset).m_gl)->bufferData;
        pvVar17 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_200,(long)(int)local_21c);
        (*p_Var6)(GVar10,0x10,pvVar17,0x88e4);
        GVar13 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar13,
                        "bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53b);
        dVar11 = ::deGetFalse();
      } while (dVar11 != 0);
      do {
        p_Var7 = ((this->super_ContextReset).m_gl)->bindBufferBase;
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->m_buffers,(long)(int)local_21c);
        (*p_Var7)(GVar10,local_21c,*pvVar16);
        GVar13 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar13,"bindBufferBase(resType, bufNdx, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53c);
        dVar11 = ::deGetFalse();
      } while (dVar11 != 0);
    }
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_200);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void ShadersOOB::setup (void)
{
	glu::ShaderProgram program(m_gl, genSources());

	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	const glw::GLint indexLocation = m_gl.getUniformLocation(program.getProgram(), "u_index");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(indexLocation != (glw::GLint)-1);

	const glw::GLint index = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(indexLocation, index));

	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		// Setup vertices position
		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	// Create dummy data for filling buffer objects
	const std::vector<tcu::Vec4> refValues(s_numBindings, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f));
	glw::GLenum resType = (m_isUBO) ? GL_UNIFORM_BUFFER : GL_SHADER_STORAGE_BUFFER;

	if (!m_isLocalArray)
	{
		// Set up interface block of buffer bindings
		GLU_CHECK_GLW_CALL(m_gl, genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]));

		for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
		{
			GLU_CHECK_GLW_CALL(m_gl, bindBuffer(resType, m_buffers[bufNdx]));
			GLU_CHECK_GLW_CALL(m_gl, bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW));
			GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(resType, bufNdx, m_buffers[bufNdx]));
		}
	}
}